

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O0

gravity_value_t convert_map2string(gravity_vm *vm,gravity_map_t *map)

{
  uint32_t n;
  uint uVar1;
  uint uVar2;
  gravity_list_t *data;
  gravity_value_t *pgVar3;
  gravity_value_t gVar4;
  uint local_104;
  char *local_100;
  uint local_f4;
  char *local_f0;
  gravity_class_t *local_e8;
  gravity_class_t *local_e0;
  uint32_t len2;
  char *s2;
  uint32_t len1;
  char *s1;
  gravity_string_t *value_string;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 local_a8;
  gravity_string_t *key_string;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 local_80;
  gravity_class_t *local_78;
  gravity_value_t value;
  gravity_value_t *valueptr;
  gravity_value_t key;
  uint32_t i;
  gravity_list_t *list;
  uint32_t count;
  uint32_t pos;
  char *buffer;
  uint32_t len;
  gravity_map_t *map_local;
  gravity_vm *vm_local;
  gravity_value_t result;
  
  buffer._4_4_ = 0x200;
  _count = (char *)gravity_calloc((gravity_vm *)0x0,1,0x201);
  *_count = '[';
  list._4_4_ = 1;
  n = gravity_hash_count(map->hash);
  data = gravity_list_new(vm,n);
  gravity_hash_iterate(map->hash,map_keys_array,data);
  uVar1 = (uint)(data->array).n;
  for (key.field_1.n._4_4_ = 0; (uint)key.field_1.n._4_4_ < uVar1;
      key.field_1.n._4_4_ = key.field_1.n._4_4_ + 1) {
    pgVar3 = (data->array).p + (uint)key.field_1.n._4_4_;
    valueptr = (gravity_value_t *)pgVar3->isa;
    key.isa = (pgVar3->field_1).p;
    gVar4 = *pgVar3;
    pgVar3 = gravity_hash_lookup(map->hash,*pgVar3);
    if (pgVar3 == (gravity_value_t *)0x0) {
      local_78 = gravity_class_null;
      value.isa = (gravity_class_t *)0x0;
    }
    else {
      local_78 = pgVar3->isa;
      value.isa = (pgVar3->field_1).p;
    }
    if ((gravity_class_t *)valueptr != gravity_class_string) {
      gVar4 = convert_value2string(vm,gVar4);
      key_string = (gravity_string_t *)gVar4.isa;
      valueptr = (gravity_value_t *)key_string;
      local_80 = gVar4.field_1;
      key.isa = local_80.p;
    }
    if ((gravity_class_t *)valueptr == gravity_class_string) {
      local_e0 = key.isa;
    }
    else {
      local_e0 = (gravity_class_t *)0x0;
    }
    if ((local_78 == gravity_class_map) && (value.isa == (gravity_class_t *)map)) {
      local_78 = gravity_class_null;
      value.isa = (gravity_class_t *)0x0;
    }
    if (local_78 != gravity_class_string) {
      gVar4.field_1.p = value.isa;
      gVar4.isa = local_78;
      gVar4 = convert_value2string(vm,gVar4);
      value_string = (gravity_string_t *)gVar4.isa;
      local_78 = (gravity_class_t *)value_string;
      local_a8 = gVar4.field_1;
      value.isa = local_a8.p;
    }
    if (local_78 == gravity_class_string) {
      local_e8 = value.isa;
    }
    else {
      local_e8 = (gravity_class_t *)0x0;
    }
    if (local_e0 == (gravity_class_t *)0x0) {
      local_f0 = "N/A";
      local_f4 = 3;
    }
    else {
      local_f0 = (char *)local_e0->objclass;
      local_f4 = *(uint *)((long)&local_e0->identifier + 4);
    }
    if (local_e8 == (gravity_class_t *)0x0) {
      local_100 = "N/A";
      local_104 = 3;
    }
    else {
      local_100 = (char *)local_e8->objclass;
      local_104 = *(uint *)((long)&local_e8->identifier + 4);
    }
    if (buffer._4_4_ < local_f4 + local_104 + list._4_4_ + 4) {
      buffer._4_4_ = local_f4 + local_104 + list._4_4_ + 4 + buffer._4_4_;
      _count = (char *)gravity_realloc((gravity_vm *)0x0,_count,(ulong)buffer._4_4_);
    }
    memcpy(_count + list._4_4_,local_f0,(ulong)local_f4);
    _count[local_f4 + list._4_4_] = ':';
    uVar2 = local_f4 + list._4_4_ + 1;
    memcpy(_count + uVar2,local_100,(ulong)local_104);
    list._4_4_ = local_104 + uVar2;
    if (key.field_1.n._4_4_ + 1 < uVar1) {
      _count[list._4_4_] = ',';
      list._4_4_ = list._4_4_ + 1;
    }
  }
  _count[list._4_4_] = ']';
  _count[list._4_4_ + 1] = '\0';
  gVar4 = gravity_string_to_value(vm,_count,list._4_4_ + 1);
  free(_count);
  return gVar4;
}

Assistant:

static inline gravity_value_t convert_map2string (gravity_vm *vm, gravity_map_t *map) {
    // allocate initial memory to a 512 buffer
    uint32_t len = 512;
    char *buffer = mem_alloc(NULL, len+1);
    buffer[0] = '[';
    uint32_t pos = 1;

    // get keys list
    uint32_t count = gravity_hash_count(map->hash);
    gravity_list_t *list = gravity_list_new(vm, count);
    gravity_hash_iterate(map->hash, map_keys_array, (void *)list);

    count = (uint32_t) marray_size(list->array);
    for (uint32_t i=0; i<count; ++i) {
        gravity_value_t key = marray_get(list->array, i);
        gravity_value_t *valueptr = gravity_hash_lookup(map->hash, key);
        gravity_value_t value = (valueptr) ? *valueptr : VALUE_FROM_NULL;
        
        // key conversion
        if (!VALUE_ISA_STRING(key)) {
            key = convert_value2string(vm, key);
        }
        gravity_string_t *key_string = (VALUE_ISA_STRING(key)) ? VALUE_AS_STRING(key) : NULL;
        
        // value conversion
        if (VALUE_ISA_MAP(value) && (VALUE_AS_MAP(value) == map)) {
            // to avoid infinite loop
            value = VALUE_FROM_NULL;
        }
        if (!VALUE_ISA_STRING(value)) {
            value = convert_value2string(vm, value);
        }
        gravity_string_t *value_string = (VALUE_ISA_STRING(value)) ? VALUE_AS_STRING(value) : NULL;
        
        // KEY
        char *s1 = (key_string) ? key_string->s : "N/A";
        uint32_t len1 = (key_string) ? key_string->len : 3;

        // VALUE
        char *s2 = (value_string) ? value_string->s : "N/A";
        uint32_t len2 = (value_string) ? value_string->len : 3;

        // check if buffer needs to be reallocated
        if (len1 + len2 + pos + 4 > len) {
            len = (len1 + len2 + pos + 4) + len;
            buffer = mem_realloc(NULL, buffer, len);
        }

        // copy key string to new buffer
        memcpy(buffer+pos, s1, len1);
        pos += len1;

        // copy ':' key/value separator
        memcpy(buffer+pos, ":", 1);
        pos += 1;

        // copy value string to new buffer
        memcpy(buffer+pos, s2, len2);
        pos += len2;

        // add entries separator
        if (i+1 < count) {
            memcpy(buffer+pos, ",", 1);
            pos += 1;
        }
    }

    // Write latest ] character
    memcpy(buffer+pos, "]", 1);
    buffer[++pos] = 0;

    gravity_value_t result = VALUE_FROM_STRING(vm, buffer, pos);
    mem_free(buffer);
    return result;
}